

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_true>_>_>
::_update_largest_death_in_F
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_true>_>_>
           *this,vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                 *chainsInF)

{
  uint targetColumnIndex;
  pointer ppVar1;
  pointer ppVar2;
  
  ppVar1 = (chainsInF->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  targetColumnIndex = ppVar1->first;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_true>_>_>
  ::operator*=((this->matrix_).
               super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_false,_false,_true>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + targetColumnIndex,&ppVar1->second);
  ppVar1 = (chainsInF->
           super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  while (ppVar2 = ppVar1 + 1,
        ppVar2 != (chainsInF->
                  super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
    multiply_source_and_add_to(this,&ppVar1[1].second,ppVar2->first,targetColumnIndex);
    ppVar1 = ppVar2;
  }
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::_update_largest_death_in_F(const std::vector<Entry_representative>& chainsInF)
{
  if constexpr (Master_matrix::Option_list::is_z2) {
    Index toUpdate = chainsInF[0];
    for (auto other_col_it = chainsInF.begin() + 1; other_col_it != chainsInF.end(); ++other_col_it) {
      add_to(*other_col_it, toUpdate);
    }
  } else {
    Index toUpdate = chainsInF[0].first;
    get_column(toUpdate) *= chainsInF[0].second;
    for (auto other_col_it = chainsInF.begin() + 1; other_col_it != chainsInF.end(); ++other_col_it) {
      multiply_source_and_add_to(other_col_it->second, other_col_it->first, toUpdate);
    }
  }
}